

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O0

void __thiscall
TPZMatrix<long_double>::MultAdd
          (TPZMatrix<long_double> *this,TPZFMatrix<long_double> *x,TPZFMatrix<long_double> *y,
          TPZFMatrix<long_double> *z,longdouble alpha,longdouble beta,int opt)

{
  int64_t iVar1;
  int64_t iVar2;
  int64_t iVar3;
  longdouble *plVar4;
  long *in_RCX;
  TPZBaseMatrix *in_RDX;
  TPZBaseMatrix *in_RSI;
  TPZFMatrix<long_double> *in_RDI;
  int in_R8D;
  longdouble in_ST0;
  longdouble in_ST1;
  longdouble lVar5;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble lVar6;
  longdouble lVar7;
  unkbyte10 in_stack_00000008;
  longdouble val;
  int64_t r;
  int64_t c;
  int64_t ic;
  int64_t xcols;
  int64_t cols;
  int64_t rows;
  undefined6 in_stack_000000ea;
  char *in_stack_000000f0;
  int64_t in_stack_ffffffffffffff00;
  undefined2 in_stack_ffffffffffffff08;
  undefined2 in_stack_ffffffffffffff0a;
  undefined4 in_stack_ffffffffffffff0c;
  undefined6 in_stack_ffffffffffffff10;
  undefined2 in_stack_ffffffffffffff16;
  int opt_00;
  int64_t in_stack_ffffffffffffff40;
  undefined2 in_stack_ffffffffffffff48;
  undefined6 uStack_b6;
  TPZFMatrix<long_double> *in_stack_ffffffffffffff58;
  undefined2 in_stack_ffffffffffffff60;
  undefined6 in_stack_ffffffffffffff62;
  longdouble local_98;
  long local_80;
  long local_78;
  long local_70;
  int64_t local_68;
  int64_t local_60;
  int64_t local_58;
  int local_4c;
  unkbyte10 local_38;
  long *local_20;
  TPZBaseMatrix *local_18;
  TPZBaseMatrix *local_10;
  
  local_38 = in_stack_00000008;
  lVar7 = in_ST5;
  local_4c = in_R8D;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  if (in_R8D == 0) {
    iVar1 = TPZBaseMatrix::Cols((TPZBaseMatrix *)in_RDI);
    in_stack_ffffffffffffff48 = (undefined2)iVar1;
    uStack_b6 = (undefined6)((ulong)iVar1 >> 0x10);
    iVar1 = TPZBaseMatrix::Rows(local_10);
    if (CONCAT62(uStack_b6,in_stack_ffffffffffffff48) == iVar1) goto LAB_012c848b;
LAB_012c84b4:
    Error(in_stack_000000f0,(char *)CONCAT62(in_stack_000000ea,alpha._8_2_));
  }
  else {
LAB_012c848b:
    in_stack_ffffffffffffff40 = TPZBaseMatrix::Rows((TPZBaseMatrix *)in_RDI);
    iVar1 = TPZBaseMatrix::Rows(local_10);
    if (in_stack_ffffffffffffff40 != iVar1) goto LAB_012c84b4;
  }
  iVar1 = TPZBaseMatrix::Cols(local_10);
  iVar2 = TPZBaseMatrix::Cols(local_18);
  if (iVar1 == iVar2) {
    iVar2 = TPZBaseMatrix::Rows(local_10);
    iVar3 = TPZBaseMatrix::Rows(local_18);
    opt_00 = (int)((ulong)iVar1 >> 0x20);
    if (iVar2 == iVar3) goto LAB_012c852c;
  }
  opt_00 = (int)((ulong)iVar1 >> 0x20);
  Error(in_stack_000000f0,(char *)CONCAT62(in_stack_000000ea,alpha._8_2_));
LAB_012c852c:
  local_58 = TPZBaseMatrix::Rows((TPZBaseMatrix *)in_RDI);
  local_60 = TPZBaseMatrix::Cols((TPZBaseMatrix *)in_RDI);
  local_68 = TPZBaseMatrix::Cols(local_10);
  PrepareZ((TPZMatrix<long_double> *)CONCAT62(in_stack_ffffffffffffff62,in_stack_ffffffffffffff60),
           in_stack_ffffffffffffff58,in_RDI,
           (longdouble)CONCAT28(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40),opt_00);
  local_98 = (longdouble)0;
  for (local_70 = 0; local_70 < local_68; local_70 = local_70 + 1) {
    if (local_4c == 0) {
      for (local_78 = 0; local_78 < local_60; local_78 = local_78 + 1) {
        for (local_80 = 0; local_80 < local_58; local_80 = local_80 + 1) {
          plVar4 = TPZFMatrix<long_double>::operator()
                             ((TPZFMatrix<long_double> *)
                              CONCAT26(in_stack_ffffffffffffff16,in_stack_ffffffffffffff10),
                              CONCAT44(in_stack_ffffffffffffff0c,
                                       CONCAT22(in_stack_ffffffffffffff0a,in_stack_ffffffffffffff08)
                                      ),in_stack_ffffffffffffff00);
          lVar6 = *plVar4;
          in_stack_ffffffffffffff0c = (undefined4)local_38;
          in_stack_ffffffffffffff10 = (undefined6)((unkuint10)local_38 >> 0x20);
          (*(in_RDI->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable.
            _vptr_TPZSavable[0x24])(in_RDI,local_80,local_78);
          lVar5 = (longdouble)CONCAT64(in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c) * in_ST0
          ;
          in_ST0 = in_ST2;
          in_ST2 = in_ST4;
          in_ST4 = lVar7;
          (*(local_10->super_TPZSavable)._vptr_TPZSavable[0x24])(local_10,local_78,local_70);
          local_98 = lVar6 + lVar5 * in_ST1;
          lVar6 = in_ST4;
          lVar7 = in_ST4;
          (**(code **)(*local_20 + 0x118))(local_20,local_80,local_70,&local_98);
          in_ST1 = in_ST3;
          in_ST3 = in_ST5;
          in_ST5 = lVar6;
        }
      }
    }
    else {
      for (local_80 = 0; local_80 < local_58; local_80 = local_80 + 1) {
        local_98 = (longdouble)0;
        for (local_78 = 0; local_78 < local_60; local_78 = local_78 + 1) {
          (*(in_RDI->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable.
            _vptr_TPZSavable[0x24])(in_RDI,local_78,local_80);
          in_stack_ffffffffffffff00 = SUB108(in_ST0,0);
          in_stack_ffffffffffffff08 = (undefined2)((unkuint10)in_ST0 >> 0x40);
          in_ST0 = in_ST2;
          in_ST2 = in_ST4;
          in_ST4 = lVar7;
          (*(local_10->super_TPZSavable)._vptr_TPZSavable[0x24])(local_10,local_78,local_70);
          local_98 = local_98 +
                     (longdouble)CONCAT28(in_stack_ffffffffffffff08,in_stack_ffffffffffffff00) *
                     in_ST1;
          in_ST1 = in_ST3;
          in_ST3 = in_ST5;
          in_ST5 = in_ST4;
          lVar7 = in_ST4;
        }
        lVar7 = in_ST5;
        (**(code **)(*local_20 + 0x118))(local_20,local_80,local_70,&stack0xffffffffffffff58);
      }
    }
  }
  return;
}

Assistant:

void TPZMatrix<TVar>::MultAdd(const TPZFMatrix<TVar> &x,const TPZFMatrix<TVar> &y, TPZFMatrix<TVar> &z, const TVar alpha,const TVar beta,const int opt) const {
	if ((!opt && Cols() != x.Rows()) || Rows() != x.Rows())
		Error( "Operator* <matrices with incompatible dimensions>" );
	if(x.Cols() != y.Cols() || x.Rows() != y.Rows()) {
		Error ("TPZFMatrix::MultiplyAdd incompatible dimensions\n");
	}
	int64_t rows = Rows();
	int64_t cols = Cols();
	int64_t xcols = x.Cols();
	int64_t ic, c, r;
	PrepareZ(y,z,beta,opt);
	TVar val = 0.;
	for (ic = 0; ic < xcols; ic++) {
		if(!opt) {
			for ( c = 0; c<cols; c++) {
				for ( r = 0; r < rows; r++ ) {
					val = z(r,ic) + alpha * GetVal(r,c) * x.GetVal(c,ic);
					z.PutVal(r,ic,val);
				}
			}
		} else {
			for (r = 0; r<rows; r++) {
            	val = 0.;
				for(c = 0; c<cols; c++) {
					val += GetVal(c,r)* x.GetVal(c,ic);
				}
				z.PutVal(r,ic,alpha*val);
			}
		}
	}
}